

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<unsigned_long&>(String *__return_storage_ptr__,kj *this,unsigned_long *params)

{
  CappedArray<char,_26UL> *params_00;
  CappedArray<char,_26UL> CStack_38;
  
  toCharSequence<unsigned_long&>(&CStack_38,this,params);
  _::concat<kj::CappedArray<char,26ul>>(__return_storage_ptr__,(_ *)&CStack_38,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}